

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O3

string * toString_abi_cxx11_(string *__return_storage_ptr__,Range *range)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"[",1);
  poVar1 = std::ostream::_M_insert<double>(*(double *)range);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::ostream::_M_insert<double>(*(double *)(range + 8));
  if ((*(double *)(range + 0x10) != 0.0) || (NAN(*(double *)(range + 0x10)))) {
    std::__ostream_insert<char,std::char_traits<char>>(local_198,", ",2);
    std::ostream::_M_insert<double>(*(double *)(range + 0x10));
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"]",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(const SoapySDR::Range &range)
{
    std::stringstream ss;
    ss << "[" << range.minimum() << ", " << range.maximum();
    if (range.step() != 0.0) ss << ", " << range.step();
    ss << "]";
    return ss.str();
}